

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O3

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceGaps
          (EdgeTracer *this,PointF dEdge,RegressionLine *line,int maxStepSize,
          RegressionLine *finishLine,double minDist)

{
  pointer *ppPVar1;
  pointer pPVar2;
  BitMatrix *pBVar3;
  ByteMatrix *pBVar4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  uint uVar9;
  Value VVar10;
  double *pdVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  double dVar18;
  PointT<double> p;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  PointF PVar27;
  undefined1 auVar28 [16];
  double dVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  PointT<double> PVar36;
  PointT<double> p_00;
  PointT<double> local_c8;
  int local_ac;
  double local_48;
  double dStack_40;
  
  dVar19 = dEdge.y;
  dVar20 = dEdge.x;
  auVar25._0_8_ = SQRT(dVar20 * dVar20 + dVar19 * dVar19);
  auVar25._8_8_ = auVar25._0_8_;
  PVar27 = (PointF)divpd((undefined1  [16])dEdge,auVar25);
  line->_directionInward = PVar27;
  p = (this->super_BitMatrixCursorF).p;
  iVar15 = 0;
  if ((((p.x == 0.0) && (!NAN(p.x))) && (p.y == 0.0)) && (!NAN(p.y))) {
    return false;
  }
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar20;
  uVar8 = (uint)(ABS(dVar19) < ABS(dVar20));
  auVar24._0_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar24._4_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar24._8_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar24._12_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar19;
  auVar25 = ~auVar24 & auVar6 << 0x40 | auVar28 & auVar24;
  local_ac = 0;
  uVar8 = maxStepSize;
  do {
    iVar16 = iVar15 + 1;
    iVar14 = iVar16;
    if (iVar15 == 0) {
      iVar14 = 2;
    }
    if (iVar14 * maxStepSize < local_ac) {
      return false;
    }
    dVar20 = line->a;
    dVar19 = p.x;
    dVar32 = p.y;
    if ((!NAN(dVar20)) && ((dVar20 * dVar19 + dVar32 * line->b) - line->c < -5.0)) {
      bVar7 = RegressionLine::evaluate<double>
                        (line,(line->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                         (line->_points).
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (!bVar7) {
        return false;
      }
      p = (this->super_BitMatrixCursorF).p;
      dVar20 = line->a;
      pdVar11 = &(line->_directionInward).y;
      if (!NAN(dVar20)) {
        pdVar11 = &line->b;
      }
      if (((double)(~-(ulong)(!NAN(dVar20) && !NAN(dVar20)) & (ulong)(line->_directionInward).x |
                   -(ulong)(!NAN(dVar20) && !NAN(dVar20)) & (ulong)dVar20) * p.x + p.y * *pdVar11) -
          line->c < -5.0) {
        return false;
      }
    }
    if ((NAN(dVar20)) || ((dVar20 * p.x + p.y * line->b) - line->c <= 3.0)) {
      pPVar2 = (line->_points).
               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((line->_points).
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start == pPVar2) {
        RegressionLine::add(line,p);
        dVar20 = 0.0;
        dVar21 = 0.0;
LAB_00153dce:
        dVar18 = ABS(dVar21);
        if (ABS(dVar21) <= ABS(dVar20)) {
          dVar18 = ABS(dVar20);
        }
        if (dVar18 < 2.0) {
          iVar16 = iVar15;
          if ((iVar15 == 0) &&
             (iVar16 = 0,
             (int)(uVar8 * 2) <=
             (int)((ulong)((long)(line->_points).
                                 super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(line->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
            return false;
          }
          goto LAB_00153e95;
        }
      }
      else {
        PVar36 = (this->super_BitMatrixCursorF).d;
        dVar18 = PVar36.x;
        dVar33 = SUB168((undefined1  [16])PVar36 & _DAT_001922a0,8);
        dVar23 = SUB168((undefined1  [16])PVar36 & _DAT_001922a0,0);
        if (dVar23 <= dVar33) {
          dVar18 = 0.0;
        }
        dVar20 = p.x - pPVar2[-1].x;
        dVar21 = p.y - pPVar2[-1].y;
        RegressionLine::add(line,p);
        if (dVar18 * dVar20 + dVar21 * (double)(~-(ulong)(dVar33 < dVar23) & (ulong)PVar36.y) <= 1.0
           ) goto LAB_00153dce;
      }
      if ((0 < iVar15) ||
         (0x50 < (ulong)((long)(line->_points).
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(line->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        bVar7 = updateDirectionFromLine(this,line);
        if (!bVar7) {
          return false;
        }
        if ((2 < iVar15 && minDist != 0.0) &&
           (pPVar2 = (line->_points).
                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           dVar20 = (this->super_BitMatrixCursorF).p.x - pPVar2->x,
           dVar21 = (this->super_BitMatrixCursorF).p.y - pPVar2->y,
           minDist < SQRT(dVar20 * dVar20 + dVar21 * dVar21))) {
          ppPVar1 = &(line->_points).
                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + -1;
          return true;
        }
      }
    }
    else {
      dVar21 = (this->super_BitMatrixCursorF).d.x;
      dVar18 = (this->super_BitMatrixCursorF).d.y;
      dVar33 = SQRT(dVar21 * dVar21 + dVar18 * dVar18);
      if (0.7 < ABS((dVar21 / dVar33) * dVar20 + line->b * (dVar18 / dVar33))) {
        return false;
      }
      bVar7 = RegressionLine::evaluate(line,1.5,false);
      if (!bVar7) {
        return false;
      }
      dVar18 = (this->super_BitMatrixCursorF).p.x;
      dVar33 = (this->super_BitMatrixCursorF).p.y;
      dVar20 = line->a;
      uVar9 = (uint)(!NAN(dVar20) && !NAN(dVar20));
      auVar29._0_8_ = CONCAT44((int)(uVar9 << 0x1f) >> 0x1f,(int)(uVar9 << 0x1f) >> 0x1f);
      auVar29._8_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
      auVar29._12_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
      auVar34._0_8_ = (ulong)dVar20 & auVar29._0_8_;
      auVar34._8_8_ = (ulong)line->b & auVar29._8_8_;
      auVar30._0_8_ = ~auVar29._0_8_ & (ulong)(line->_directionInward).x;
      auVar30._8_8_ = ~auVar29._8_8_ & (ulong)(line->_directionInward).y;
      dVar26 = SUB168(auVar30 | auVar34,8);
      dVar23 = SUB168(auVar30 | auVar34,0);
      dVar20 = (dVar23 * dVar18 + dVar33 * dVar26) - line->c;
      dVar18 = dVar18 - dVar20 * dVar23;
      dVar33 = dVar33 - dVar20 * dVar26;
      pPVar2 = (line->_points).
               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      dVar20 = pPVar2[-1].x;
      dVar21 = pPVar2[-1].y;
      dVar35 = (dVar23 * dVar20 + dVar26 * dVar21) - line->c;
      dVar20 = dVar20 - dVar23 * dVar35;
      dVar21 = dVar21 - dVar35 * dVar26;
      dVar23 = dVar18 - dVar20;
      dVar26 = dVar33 - dVar21;
      if (SQRT(dVar23 * dVar23 + dVar26 * dVar26) < 1.0) {
        do {
          dVar18 = dVar18 + (this->super_BitMatrixCursorF).d.x;
          dVar33 = dVar33 + (this->super_BitMatrixCursorF).d.y;
          dVar23 = dVar18 - dVar20;
          dVar26 = dVar33 - dVar21;
        } while (SQRT(dVar23 * dVar23 + dVar26 * dVar26) < 1.0);
      }
      dVar20 = floor(dVar18);
      dVar21 = floor(dVar33);
      (this->super_BitMatrixCursorF).p.x = dVar20 + 0.5;
      (this->super_BitMatrixCursorF).p.y = dVar21 + 0.5;
      iVar16 = iVar15;
    }
LAB_00153e95:
    iVar15 = iVar16;
    uVar9 = uVar8;
    if ((!NAN(finishLine->a)) &&
       (uVar9 = (uint)((finishLine->a * (this->super_BitMatrixCursorF).p.x +
                       (this->super_BitMatrixCursorF).p.y * finishLine->b) - finishLine->c),
       (int)uVar8 < (int)uVar9)) {
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
    local_ac = local_ac + 1;
    iVar14 = NAN(line->a) + 2 + (uint)NAN(line->a);
    if (uVar8 == 1) {
      iVar14 = 3;
    }
    iVar16 = 1;
    while ((int)uVar8 < 1) {
LAB_00153fbc:
      iVar16 = iVar16 + 1;
      if (iVar16 == iVar14) {
        if (NAN(finishLine->a)) {
          return false;
        }
        return (int)((finishLine->a * (this->super_BitMatrixCursorF).p.x +
                     (this->super_BitMatrixCursorF).p.y * finishLine->b) - finishLine->c) <=
               (int)(uVar8 + 1);
      }
    }
    uVar9 = 1;
LAB_00153f12:
    uVar13 = 0;
    do {
      if (((uVar9 >> 2) * 2 + 2) * iVar16 + 1 == (int)uVar13) goto LAB_00153fa7;
      uVar17 = (int)uVar13 + 1;
      uVar12 = -(int)(uVar13 >> 1);
      if ((uVar13 & 1) != 0) {
        uVar12 = uVar17 >> 1;
      }
      local_48 = auVar25._0_8_;
      dStack_40 = auVar25._8_8_;
      local_c8.x = (double)(int)uVar12 * local_48 +
                   (this->super_BitMatrixCursorF).d.x * (double)(int)uVar9 +
                   (this->super_BitMatrixCursorF).p.x;
      local_c8.y = (double)(int)uVar12 * dStack_40 +
                   (this->super_BitMatrixCursorF).d.y * (double)(int)uVar9 +
                   (this->super_BitMatrixCursorF).p.y;
      PVar36.x = local_48 + local_c8.x;
      PVar36.y = dStack_40 + local_c8.y;
      VVar10 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                         (&this->super_BitMatrixCursorF,PVar36);
      uVar13 = (ulong)uVar17;
    } while (VVar10.v != 1);
    uVar9 = 3;
    if (3 < (int)uVar8) {
      uVar9 = uVar8;
    }
    while( true ) {
      if (local_c8.x < 0.0) {
        return false;
      }
      pBVar3 = (this->super_BitMatrixCursorF).img;
      if ((double)pBVar3->_width <= local_c8.x) {
        return false;
      }
      if (local_c8.y < 0.0) {
        return false;
      }
      if ((double)pBVar3->_height <= local_c8.y) {
        return false;
      }
      VVar10 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                         (&this->super_BitMatrixCursorF,local_c8);
      if (VVar10.v == 0) break;
      local_c8.x = local_c8.x - local_48;
      local_c8.y = local_c8.y - dStack_40;
      p_00.x = local_c8.x - (this->super_BitMatrixCursorF).d.x;
      p_00.y = local_c8.y - (this->super_BitMatrixCursorF).d.y;
      VVar10 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                         (&this->super_BitMatrixCursorF,p_00);
      uVar12 = (uint)(VVar10.v == 1);
      auVar22._0_8_ = CONCAT44((int)(uVar12 << 0x1f) >> 0x1f,(int)(uVar12 << 0x1f) >> 0x1f);
      auVar22._8_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
      auVar22._12_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
      auVar31._0_8_ = (ulong)(local_c8.x - (this->super_BitMatrixCursorF).d.x) & auVar22._0_8_;
      auVar31._8_8_ = (ulong)(local_c8.y - (this->super_BitMatrixCursorF).d.y) & auVar22._8_8_;
      local_c8 = (PointT<double>)(auVar31 | ~auVar22 & (undefined1  [16])local_c8);
      uVar9 = uVar9 - 1;
      if (uVar9 == 0) {
        return false;
      }
    }
    dVar20 = floor(local_c8.x);
    dVar21 = floor(local_c8.y);
    p.x = dVar20 + 0.5;
    p.y = dVar21 + 0.5;
    (this->super_BitMatrixCursorF).p = p;
    pBVar4 = this->history;
    if (pBVar4 != (ByteMatrix *)0x0 && uVar8 == 1) {
      iVar14 = (int)p.y * (pBVar4->super_Matrix<signed_char>)._width + (int)p.x;
      pcVar5 = (pBVar4->super_Matrix<signed_char>)._data.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->state == (int)pcVar5[iVar14]) {
        return false;
      }
      pcVar5[iVar14] = (char)this->state;
      p = (this->super_BitMatrixCursorF).p;
    }
    if (((p.x == dVar19) && (!NAN(p.x) && !NAN(dVar19))) && (dVar32 == p.y)) {
      return false;
    }
  } while( true );
LAB_00153fa7:
  bVar7 = uVar9 == uVar8;
  uVar9 = uVar9 + 1;
  if (bVar7) goto LAB_00153fbc;
  goto LAB_00153f12;
}

Assistant:

bool traceGaps(PointF dEdge, RegressionLine& line, int maxStepSize, const RegressionLine& finishLine = {}, double minDist = 0)
	{
		line.setDirectionInward(dEdge);
		int gaps = 0, steps = 0, maxStepsPerGap = maxStepSize;
		PointF lastP;
		do {
			// detect an endless loop (lack of progress). if encountered, please report.
			// this fixes a deadlock in falsepositives-1/#570.png and the regression in #574
			if (p == std::exchange(lastP, p) || steps++ > (gaps == 0 ? 2 : gaps + 1) * maxStepsPerGap)
				return false;
			log(p);

			// if we drifted too far outside of the code, break
			if (line.isValid() && line.signedDistance(p) < -5 && (!line.evaluate() || line.signedDistance(p) < -5))
				return false;

			// if we are drifting towards the inside of the code, pull the current position back out onto the line
			if (line.isValid() && line.signedDistance(p) > 3) {
				// The current direction d and the line we are tracing are supposed to be roughly parallel.
				// In case the 'go outward' step in traceStep lead us astray, we might end up with a line
				// that is almost perpendicular to d. Then the back-projection below can result in an
				// endless loop. Break if the angle between d and line is greater than 45 deg.
				if (std::abs(dot(normalized(d), line.normal())) > 0.7) // thresh is approx. sin(45 deg)
					return false;

				// re-evaluate line with all the points up to here before projecting
				if (!line.evaluate(1.5))
					return false;

				auto np = line.project(p);
				// make sure we are making progress even when back-projecting:
				// consider a 90deg corner, rotated 45deg. we step away perpendicular from the line and get
				// back projected where we left off the line.
				// The 'while' instead of 'if' was introduced to fix the issue with #245. It turns out that
				// np can actually be behind the projection of the last line point and we need 2 steps in d
				// to prevent a dead lock. see #245.png
				while (distance(np, line.project(line.points().back())) < 1)
					np = np + d;
				p = centered(np);
			}
			else {
				auto curStep = line.points().empty() ? PointF() : p - line.points().back();
				auto stepLengthInMainDir = line.points().empty() ? 0.0 : dot(mainDirection(d), curStep);
				line.add(p);

				if (stepLengthInMainDir > 1 || maxAbsComponent(curStep) >= 2) {
					++gaps;
					if (gaps >= 2 || line.points().size() > 5) {
						if (!updateDirectionFromLine(line))
							return false;
						// check if the first half of the top-line trace is complete.
						// the minimum code size is 10x10 -> every code has at least 4 gaps
						if (minDist && gaps >= 4 && distance(p, line.points().front()) > minDist) {
							// undo the last insert, it will be inserted again after the restart
							line.pop_back();
							--gaps;
							return true;
						}
					}
				} else if (gaps == 0 && Size(line.points()) >= 2 * maxStepSize) {
					return false; // no point in following a line that has no gaps
				}
			}

			if (finishLine.isValid())
				UpdateMin(maxStepSize, static_cast<int>(finishLine.signedDistance(p)));

			auto stepResult = traceStep(dEdge, maxStepSize, line.isValid());

			if (stepResult != StepResult::FOUND)
				// we are successful iff we found an open end across a valid finishLine
				return stepResult == StepResult::OPEN_END && finishLine.isValid() &&
					   static_cast<int>(finishLine.signedDistance(p)) <= maxStepSize + 1;
		} while (true);
	}